

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_set_standard_lookup.c
# Opt level: O0

char * lookup_gname_helper(name_cache *cache,id_t id)

{
  archive *a;
  int iVar1;
  char *pcVar2;
  size_t __size;
  int *piVar3;
  int r;
  size_t nbuff_size;
  char *nbuff;
  group *result;
  group grent;
  id_t id_local;
  name_cache *cache_local;
  
  grent.gr_mem._4_4_ = id;
  if (cache->buff_size == 0) {
    cache->buff_size = 0x100;
    pcVar2 = (char *)malloc(cache->buff_size);
    cache->buff = pcVar2;
  }
  if (cache->buff == (char *)0x0) {
    cache_local = (name_cache *)0x0;
  }
  else {
    while( true ) {
      nbuff = (char *)&result;
      iVar1 = getgrgid_r(grent.gr_mem._4_4_,(group *)&result,cache->buff,cache->buff_size,
                         (group **)&nbuff);
      if ((iVar1 == 0) || (iVar1 != 0x22)) break;
      __size = cache->buff_size << 1;
      pcVar2 = (char *)realloc(cache->buff,__size);
      if (pcVar2 == (char *)0x0) break;
      cache->buff = pcVar2;
      cache->buff_size = __size;
    }
    if (iVar1 == 0) {
      if (nbuff == (char *)0x0) {
        cache_local = (name_cache *)0x0;
      }
      else {
        cache_local = (name_cache *)strdup(*(char **)nbuff);
      }
    }
    else {
      a = cache->archive;
      piVar3 = __errno_location();
      archive_set_error(a,*piVar3,"Can\'t lookup group for id %d",(ulong)grent.gr_mem._4_4_);
      cache_local = (name_cache *)0x0;
    }
  }
  return (char *)cache_local;
}

Assistant:

static const char *
lookup_gname_helper(struct name_cache *cache, id_t id)
{
	struct group	grent, *result;
	char * nbuff;
	size_t nbuff_size;
	int r;

	if (cache->buff_size == 0) {
		cache->buff_size = 256;
		cache->buff = malloc(cache->buff_size);
	}
	if (cache->buff == NULL)
		return (NULL);
	for (;;) {
		result = &grent; /* Old getgrgid_r ignores last arg. */
		r = getgrgid_r((gid_t)id, &grent,
			       cache->buff, cache->buff_size, &result);
		if (r == 0)
			break;
		if (r != ERANGE)
			break;
		/* ERANGE means our buffer was too small, but POSIX
		 * doesn't tell us how big the buffer should be, so
		 * we just double it and try again. */
		nbuff_size = cache->buff_size * 2;
		nbuff = realloc(cache->buff, nbuff_size);
		if (nbuff == NULL)
			break;
		cache->buff = nbuff;
		cache->buff_size = nbuff_size;
	}
	if (r != 0) {
		archive_set_error(cache->archive, errno,
		    "Can't lookup group for id %d", (int)id);
		return (NULL);
	}
	if (result == NULL)
		return (NULL);

	return strdup(result->gr_name);
}